

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_response.cpp
# Opt level: O0

void __thiscall cppcms::http::response::set_xhtml_header(response *this)

{
  string *in_stack_00000098;
  response *in_stack_000000a0;
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"text/xhtml",&local_29);
  set_content_header(in_stack_000000a0,in_stack_00000098);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  return;
}

Assistant:

void response::set_xhtml_header()
{
	set_content_header("text/xhtml");
}